

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O2

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::visit
          (ConvertComplexRemapTypes *this,Constant *c)

{
  Context *context;
  Allocator *pAVar1;
  undefined1 *puVar2;
  int iVar3;
  CommaSeparatedList *args_1;
  ArraySize AVar4;
  CommaSeparatedList *pCVar5;
  CallOrCast *pCVar6;
  uint uVar7;
  Value *in_R8;
  size_t sVar8;
  float v;
  undefined4 extraout_XMM0_Da;
  float v_00;
  undefined4 extraout_XMM0_Da_00;
  float v_01;
  undefined4 extraout_XMM0_Da_01;
  float v_02;
  undefined4 extraout_XMM0_Db;
  float v_03;
  undefined4 extraout_XMM0_Db_00;
  float v_04;
  undefined4 extraout_XMM0_Db_01;
  double in_XMM1_Qa;
  double dVar9;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  ArrayView<soul::Value> elements_01;
  ArrayView<soul::Value> elements_02;
  pool_ref<soul::AST::Expression> local_540;
  Type resultType;
  PrimitiveType local_520;
  PrimitiveType local_51c;
  PrimitiveType local_518;
  PrimitiveType local_514;
  Value local_510;
  Expression *local_4d0;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *local_4c8;
  undefined1 local_4c0 [24];
  undefined1 local_4a8 [24];
  undefined1 local_490 [24];
  undefined1 local_478 [24];
  ArrayWithPreallocation<soul::Value,_8UL> realValues;
  ArrayWithPreallocation<soul::Value,_8UL> imagValues;
  
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&realValues);
  uVar7 = realValues.items._4_4_ - 5;
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&realValues.numAllocated);
  if (1 < uVar7) {
    return &c->super_Expression;
  }
  context = &(c->super_Expression).super_Statement.super_ASTObject.context;
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&realValues,c);
  local_4d0 = getRemappedType(this,context,(Type *)&realValues);
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&realValues.numAllocated);
  args_1 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                     (&this->allocator->pool,context);
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&resultType,c);
  (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[4])(&realValues,c);
  iVar3 = realValues.items._4_4_;
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&realValues.numAllocated);
  if (iVar3 == 5) {
    if (resultType.category == vector) {
      realValues.items = (Value *)realValues.space;
      realValues.numActive = 0;
      imagValues.items = (Value *)imagValues.space;
      imagValues.numActive = 0;
      realValues.numAllocated = 8;
      imagValues.numAllocated = 8;
      sVar8 = 1;
      while( true ) {
        AVar4 = Type::getVectorSize(&resultType);
        if (AVar4 <= sVar8 - 1) break;
        soul::Value::getSlice(&local_510,&c->value,sVar8 - 1,sVar8);
        soul::Value::getAsComplex32(&local_510);
        soul::Value::~Value(&local_510);
        soul::Value::Value(&local_510,v_00);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back(&realValues,&local_510);
        soul::Value::~Value(&local_510);
        soul::Value::Value(&local_510,v_03);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back(&imagValues,&local_510);
        soul::Value::~Value(&local_510);
        sVar8 = sVar8 + 1;
      }
      pAVar1 = this->allocator;
      local_514.type = float32;
      AVar4 = Type::getVectorSize(&resultType);
      Type::createVector((Type *)local_478,&local_514,AVar4);
      elements.s = realValues.items + realValues.numActive;
      elements.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_510,(Value *)local_478,&(realValues.items)->type,elements);
      local_540.object =
           &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                      (&pAVar1->pool,context,&local_510)->super_Expression;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&args_1->items,&local_540);
      soul::Value::~Value(&local_510);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(local_478 + 0x10));
      pAVar1 = this->allocator;
      local_518.type = float32;
      AVar4 = Type::getVectorSize(&resultType);
      Type::createVector((Type *)local_490,&local_518,AVar4);
      elements_00.s = imagValues.items + imagValues.numActive;
      elements_00.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_510,(Value *)local_490,&(imagValues.items)->type,elements_00);
      local_540.object =
           &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                      (&pAVar1->pool,context,&local_510)->super_Expression;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&args_1->items,&local_540);
      soul::Value::~Value(&local_510);
      puVar2 = local_490;
LAB_00234b75:
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(puVar2 + 0x10));
      ArrayWithPreallocation<soul::Value,_8UL>::clear(&imagValues);
      ArrayWithPreallocation<soul::Value,_8UL>::clear(&realValues);
      goto LAB_00234b94;
    }
    if (resultType.category == array) {
      sVar8 = 1;
      while( true ) {
        AVar4 = Type::getArraySize(&resultType);
        if (AVar4 <= sVar8 - 1) break;
        soul::Value::getSlice((Value *)&realValues,&c->value,sVar8 - 1,sVar8);
        soul::Value::getAsComplex32((Value *)&realValues);
        soul::Value::~Value((Value *)&realValues);
        pCVar5 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (&this->allocator->pool,context);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)&realValues,v);
        imagValues.items =
             (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                                (&pAVar1->pool,context,(Value *)&realValues);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&pCVar5->items,(pool_ref<soul::AST::Expression> *)&imagValues);
        soul::Value::~Value((Value *)&realValues);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)&realValues,v_02);
        imagValues.items =
             (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                                (&pAVar1->pool,context,(Value *)&realValues);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&pCVar5->items,(pool_ref<soul::AST::Expression> *)&imagValues);
        soul::Value::~Value((Value *)&realValues);
        realValues.items = (Value *)pCVar5;
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&args_1->items,(pool_ref<soul::AST::Expression> *)&realValues);
        sVar8 = sVar8 + 1;
      }
      goto LAB_00234b94;
    }
    soul::Value::getAsComplex32(&c->value);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)&realValues,v_01);
    imagValues.items =
         (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                            (&pAVar1->pool,context,(Value *)&realValues);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
              (&args_1->items,(pool_ref<soul::AST::Expression> *)&imagValues);
    soul::Value::~Value((Value *)&realValues);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)&realValues,v_04);
    imagValues.items =
         (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                            (&pAVar1->pool,context,(Value *)&realValues);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
              (&args_1->items,(pool_ref<soul::AST::Expression> *)&imagValues);
  }
  else {
    if (resultType.category == vector) {
      realValues.items = (Value *)realValues.space;
      realValues.numActive = 0;
      imagValues.items = (Value *)imagValues.space;
      imagValues.numActive = 0;
      realValues.numAllocated = 8;
      imagValues.numAllocated = 8;
      sVar8 = 1;
      while( true ) {
        AVar4 = Type::getVectorSize(&resultType);
        if (AVar4 <= sVar8 - 1) break;
        soul::Value::getSlice(&local_510,&c->value,sVar8 - 1,sVar8);
        soul::Value::getAsComplex64(&local_510);
        dVar9 = in_XMM1_Qa;
        soul::Value::~Value(&local_510);
        soul::Value::Value(&local_510,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        ArrayWithPreallocation<soul::Value,_8UL>::push_back(&realValues,&local_510);
        soul::Value::~Value(&local_510);
        soul::Value::Value(&local_510,in_XMM1_Qa);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back(&imagValues,&local_510);
        soul::Value::~Value(&local_510);
        sVar8 = sVar8 + 1;
        in_XMM1_Qa = dVar9;
      }
      pAVar1 = this->allocator;
      local_51c.type = float64;
      AVar4 = Type::getVectorSize(&resultType);
      Type::createVector((Type *)local_4a8,&local_51c,AVar4);
      elements_01.s = realValues.items + realValues.numActive;
      elements_01.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_510,(Value *)local_4a8,&(realValues.items)->type,elements_01);
      local_540.object =
           &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                      (&pAVar1->pool,context,&local_510)->super_Expression;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&args_1->items,&local_540);
      soul::Value::~Value(&local_510);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(local_4a8 + 0x10));
      pAVar1 = this->allocator;
      local_520.type = float64;
      AVar4 = Type::getVectorSize(&resultType);
      Type::createVector((Type *)local_4c0,&local_520,AVar4);
      elements_02.s = imagValues.items + imagValues.numActive;
      elements_02.e = in_R8;
      soul::Value::createArrayOrVector
                (&local_510,(Value *)local_4c0,&(imagValues.items)->type,elements_02);
      local_540.object =
           &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                      (&pAVar1->pool,context,&local_510)->super_Expression;
      ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                (&args_1->items,&local_540);
      soul::Value::~Value(&local_510);
      puVar2 = local_4c0;
      goto LAB_00234b75;
    }
    if (resultType.category == array) {
      sVar8 = 1;
      local_4c8 = &args_1->items;
      while( true ) {
        AVar4 = Type::getArraySize(&resultType);
        if (AVar4 <= sVar8 - 1) break;
        soul::Value::getSlice((Value *)&realValues,&c->value,sVar8 - 1,sVar8);
        soul::Value::getAsComplex64((Value *)&realValues);
        dVar9 = in_XMM1_Qa;
        soul::Value::~Value((Value *)&realValues);
        pCVar5 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                           (&this->allocator->pool,context);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)&realValues,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))
        ;
        imagValues.items =
             (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                                (&pAVar1->pool,context,(Value *)&realValues);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&pCVar5->items,(pool_ref<soul::AST::Expression> *)&imagValues);
        soul::Value::~Value((Value *)&realValues);
        pAVar1 = this->allocator;
        soul::Value::Value((Value *)&realValues,in_XMM1_Qa);
        imagValues.items =
             (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                                (&pAVar1->pool,context,(Value *)&realValues);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (&pCVar5->items,(pool_ref<soul::AST::Expression> *)&imagValues);
        soul::Value::~Value((Value *)&realValues);
        realValues.items = (Value *)pCVar5;
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
                  (local_4c8,(pool_ref<soul::AST::Expression> *)&realValues);
        sVar8 = sVar8 + 1;
        in_XMM1_Qa = dVar9;
      }
      goto LAB_00234b94;
    }
    soul::Value::getAsComplex64(&c->value);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)&realValues,
                       (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    imagValues.items =
         (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                            (&pAVar1->pool,context,(Value *)&realValues);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
              (&args_1->items,(pool_ref<soul::AST::Expression> *)&imagValues);
    soul::Value::~Value((Value *)&realValues);
    pAVar1 = this->allocator;
    soul::Value::Value((Value *)&realValues,in_XMM1_Qa);
    imagValues.items =
         (Value *)PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                            (&pAVar1->pool,context,(Value *)&realValues);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::push_back
              (&args_1->items,(pool_ref<soul::AST::Expression> *)&imagValues);
  }
  soul::Value::~Value((Value *)&realValues);
LAB_00234b94:
  realValues.items = (Value *)((ulong)realValues.items & 0xffffffffffffff00);
  pCVar6 = PoolAllocator::
           allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::AST::CommaSeparatedList&,bool>
                     (&this->allocator->pool,local_4d0,args_1,(bool *)&realValues);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&resultType.structure);
  return (Expression *)pCVar6;
}

Assistant:

AST::Expression& visit (AST::Constant& c) override
        {
            super::visit (c);

            if (requiresRemapping (c.getResultType()))
            {
                auto& remappedType = getRemappedType (c.context, c.getResultType());
                auto& args = allocator.allocate<AST::CommaSeparatedList> (c.context);
                auto resultType = c.getResultType();

                if (c.getResultType().isComplex32())
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float32, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex32();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex32();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }
                else
                {
                    if (resultType.isVector())
                    {
                        ArrayWithPreallocation<Value, 8> realValues, imagValues;

                        for (size_t i = 0; i < resultType.getVectorSize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            realValues.push_back (soul::Value (v.real()));
                            imagValues.push_back (soul::Value (v.imag()));
                        }

                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), realValues)));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value::createArrayOrVector (soul::Type::createVector (PrimitiveType::float64, resultType.getVectorSize()), imagValues)));
                    }
                    else if (resultType.isArray())
                    {
                        for (size_t i = 0; i < resultType.getArraySize(); i++)
                        {
                            auto v = c.value.getSlice (i, i + 1).getAsComplex64();

                            auto& item = allocator.allocate<AST::CommaSeparatedList> (c.context);
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                            item.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));

                            args.items.push_back (item);
                        }
                    }
                    else
                    {
                        auto v = c.value.getAsComplex64();
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.real())));
                        args.items.push_back (allocator.allocate<AST::Constant> (c.context, soul::Value (v.imag())));
                    }
                }

                return allocator.allocate<AST::CallOrCast> (remappedType, args, false);
            }

            return c;
        }